

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

void Gia_ManIncrSimStop(Gia_Man_t *p)

{
  Gia_Man_t *p_local;
  
  if (p->fIncrSim != 0) {
    p->fIncrSim = 0;
    p->iPatsPi = 0;
    p->nSimWords = 0;
    p->iTimeStamp = 1;
    Vec_IntFreeP(&p->vTimeStamps);
    Vec_WrdFreeP(&p->vSims);
    return;
  }
  __assert_fail("p->fIncrSim",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                ,0x48e,"void Gia_ManIncrSimStop(Gia_Man_t *)");
}

Assistant:

void Gia_ManIncrSimStop( Gia_Man_t * p )
{
    assert( p->fIncrSim );
    p->fIncrSim   = 0;
    p->iPatsPi    = 0;
    p->nSimWords  = 0;
    p->iTimeStamp = 1;
    Vec_IntFreeP( &p->vTimeStamps );
    Vec_WrdFreeP( &p->vSims );
}